

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

void BrotliZopfliCreateCommands
               (size_t num_bytes,size_t block_start,ZopfliNode *nodes,int *dist_cache,
               size_t *last_insert_len,BrotliEncoderParams *params,Command_conflict *commands,
               size_t *num_literals)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ZopfliNode *pZVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  int iVar13;
  uint32_t uVar14;
  ulong uVar15;
  ulong uVar16;
  Command_conflict *pCVar17;
  uint local_234;
  ulong local_230;
  size_t dist_code;
  int is_dictionary;
  size_t dictionary_start;
  size_t len_code;
  size_t distance;
  size_t insert_length;
  size_t copy_length;
  ZopfliNode *next;
  size_t gap;
  size_t i;
  long lStack_1d0;
  uint32_t offset;
  size_t pos;
  size_t max_backward_limit;
  size_t stream_offset;
  BrotliEncoderParams *params_local;
  size_t *last_insert_len_local;
  int *dist_cache_local;
  ZopfliNode *nodes_local;
  size_t block_start_local;
  size_t num_bytes_local;
  uint32_t modifier;
  uint32_t short_code;
  uint32_t delta;
  size_t nbits;
  size_t offset_1;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_5a;
  uint32_t nbits_2;
  ushort local_32;
  uint32_t offset_2;
  uint16_t bits64;
  ushort local_a;
  
  sVar4 = params->stream_offset;
  uVar8 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  lStack_1d0 = 0;
  i._4_4_ = (nodes->u).next;
  gap = 0;
  while (i._4_4_ != 0xffffffff) {
    pZVar9 = nodes + lStack_1d0 + (ulong)i._4_4_;
    uVar7 = pZVar9->length & 0x1ffffff;
    distance = (size_t)(pZVar9->dcode_insert_length & 0x7ffffff);
    lStack_1d0 = distance + lStack_1d0;
    i._4_4_ = (pZVar9->u).next;
    if (gap == 0) {
      distance = *last_insert_len + distance;
      *last_insert_len = 0;
    }
    uVar1 = pZVar9->distance;
    uVar15 = block_start + lStack_1d0 + sVar4;
    local_230 = uVar8;
    if (uVar15 < uVar8) {
      local_230 = uVar15;
    }
    local_234 = pZVar9->dcode_insert_length >> 0x1b;
    if (local_234 == 0) {
      local_234 = pZVar9->distance + 0xf;
    }
    else {
      local_234 = local_234 - 1;
    }
    uVar15 = (ulong)local_234;
    pCVar17 = commands + gap;
    iVar13 = (((pZVar9->length & 0x1ffffff) + 9) - (pZVar9->length >> 0x19)) - uVar7;
    uVar14 = (uint32_t)distance;
    pCVar17->insert_len_ = uVar14;
    pCVar17->copy_len_ = uVar7 | iVar13 * 0x2000000;
    uVar2 = (params->dist).num_direct_distance_codes;
    uVar3 = (params->dist).distance_postfix_bits;
    if (uVar15 < (ulong)uVar2 + 0x10) {
      pCVar17->dist_prefix_ = (uint16_t)local_234;
      pCVar17->dist_extra_ = 0;
    }
    else {
      bVar6 = (byte)uVar3;
      uVar16 = (1L << (bVar6 + 2 & 0x3f)) + ((uVar15 - 0x10) - (ulong)uVar2);
      iVar5 = 0x1f;
      if ((uint)uVar16 != 0) {
        for (; (uint)uVar16 >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      bVar12 = (byte)(iVar5 - 1U);
      uVar10 = uVar16 >> (bVar12 & 0x3f) & 1;
      lVar11 = (ulong)(iVar5 - 1U) - (ulong)uVar3;
      pCVar17->dist_prefix_ =
           (short)lVar11 * 0x400 |
           (short)uVar2 + 0x10 + (short)((lVar11 + -1) * 2 + uVar10 << (bVar6 & 0x3f)) +
           ((ushort)uVar16 & (short)(1 << (bVar6 & 0x1f)) - 1U);
      pCVar17->dist_extra_ = (uint32_t)(uVar16 - (uVar10 + 2 << (bVar12 & 0x3f)) >> (bVar6 & 0x3f));
    }
    iVar13 = uVar7 + iVar13;
    uVar16 = (ulong)iVar13;
    if (distance < 6) {
      local_5a = (ushort)distance;
    }
    else if (distance < 0x82) {
      iVar5 = 0x1f;
      if (uVar14 - 2 != 0) {
        for (; uVar14 - 2 >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      local_5a = (short)(iVar5 + -1) * 2 + (short)(distance - 2 >> ((byte)(iVar5 + -1) & 0x3f)) + 2;
    }
    else if (distance < 0x842) {
      iVar5 = 0x1f;
      if (uVar14 - 0x42 != 0) {
        for (; uVar14 - 0x42 >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      local_5a = (short)iVar5 + 10;
    }
    else if (distance < 0x1842) {
      local_5a = 0x15;
    }
    else if (distance < 0x5842) {
      local_5a = 0x16;
    }
    else {
      local_5a = 0x17;
    }
    if (uVar16 < 10) {
      local_32 = (short)iVar13 - 2;
    }
    else if (uVar16 < 0x86) {
      iVar5 = 0x1f;
      if (iVar13 - 6U != 0) {
        for (; iVar13 - 6U >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      local_32 = (short)(iVar5 + -1) * 2 + (short)(uVar16 - 6 >> ((byte)(iVar5 + -1) & 0x3f)) + 4;
    }
    else if (uVar16 < 0x846) {
      iVar5 = 0x1f;
      if (iVar13 - 0x46U != 0) {
        for (; iVar13 - 0x46U >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      local_32 = (short)iVar5 + 0xc;
    }
    else {
      local_32 = 0x17;
    }
    local_a = local_32 & 7 | (local_5a & 7) << 3;
    if ((((pCVar17->dist_prefix_ & 0x3ff) == 0) && (local_5a < 8)) && (local_32 < 0x10)) {
      if (7 < local_32) {
        local_a = local_a | 0x40;
      }
    }
    else {
      iVar13 = ((int)(uint)local_32 >> 3) + ((int)(uint)local_5a >> 3) * 3;
      local_a = (short)iVar13 * 0x40 + 0x40 +
                ((ushort)(0x520d40 >> ((char)iVar13 * '\x02' & 0x1fU)) & 0xc0) | local_a;
    }
    pCVar17->cmd_prefix_ = local_a;
    if ((uVar1 <= local_230) && (uVar15 != 0)) {
      dist_cache[3] = dist_cache[2];
      dist_cache[2] = dist_cache[1];
      dist_cache[1] = *dist_cache;
      *dist_cache = uVar1;
    }
    *num_literals = distance + *num_literals;
    lStack_1d0 = (ulong)uVar7 + lStack_1d0;
    gap = gap + 1;
  }
  *last_insert_len = (num_bytes - lStack_1d0) + *last_insert_len;
  return;
}

Assistant:

void BrotliZopfliCreateCommands(const size_t num_bytes,
    const size_t block_start, const ZopfliNode* nodes, int* dist_cache,
    size_t* last_insert_len, const BrotliEncoderParams* params,
    Command* commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  size_t pos = 0;
  uint32_t offset = nodes[0].u.next;
  size_t i;
  size_t gap = 0;
  for (i = 0; offset != BROTLI_UINT32_MAX; i++) {
    const ZopfliNode* next = &nodes[pos + offset];
    size_t copy_length = ZopfliNodeCopyLength(next);
    size_t insert_length = next->dcode_insert_length & 0x7FFFFFF;
    pos += insert_length;
    offset = next->u.next;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    {
      size_t distance = ZopfliNodeCopyDistance(next);
      size_t len_code = ZopfliNodeLengthCode(next);
      size_t dictionary_start = BROTLI_MIN(size_t,
          block_start + pos + stream_offset, max_backward_limit);
      BROTLI_BOOL is_dictionary =
          TO_BROTLI_BOOL(distance > dictionary_start + gap);
      size_t dist_code = ZopfliNodeDistanceCode(next);
      InitCommand(&commands[i], &params->dist, insert_length,
          copy_length, (int)len_code - (int)copy_length, dist_code);

      if (!is_dictionary && dist_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = (int)distance;
      }
    }

    *num_literals += insert_length;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
}